

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache.cc
# Opt level: O3

Handle * __thiscall
leveldb::anon_unknown_0::ShardedLRUCache::Lookup(ShardedLRUCache *this,Slice *key)

{
  LRUHandle *pLVar1;
  LRUHandle *pLVar2;
  LRUHandle *pLVar3;
  uint32_t uVar4;
  LRUHandle **ppLVar5;
  ulong uVar6;
  char *this_00;
  
  uVar4 = Hash(key->data_,key->size_,0);
  uVar6 = (ulong)((uVar4 >> 0x1c) * 0x90);
  this_00 = this->shard_[0].lru_.key_data + (uVar6 - 0x70);
  port::Mutex::Lock((Mutex *)this_00);
  ppLVar5 = HandleTable::FindPointer
                      ((HandleTable *)
                       (ulong)*(uint *)((long)(&this->shard_[0].lru_ + 1) + 0x40 + (uVar6 - 0x40)),
                       *(Slice **)((long)(&this->shard_[0].lru_ + 1) + 0x40 + (uVar6 - 0x38)),
                       (uint32_t)key->data_);
  pLVar1 = *ppLVar5;
  if (pLVar1 != (LRUHandle *)0x0) {
    pLVar1->refs = pLVar1->refs + 1;
    pLVar2 = pLVar1->next;
    pLVar3 = pLVar1->prev;
    pLVar2->prev = pLVar3;
    pLVar3->next = pLVar2;
    pLVar1->next = (LRUHandle *)(this->shard_[0].lru_.key_data + (uVar6 - 0x40));
    pLVar2 = *(LRUHandle **)(this->shard_[0].lru_.key_data + (uVar6 - 0x20));
    pLVar1->prev = pLVar2;
    pLVar2->next = pLVar1;
    pLVar1->next->prev = pLVar1;
  }
  port::Mutex::Unlock((Mutex *)this_00);
  return (Handle *)pLVar1;
}

Assistant:

virtual Handle *Lookup(const Slice &key) {
                const uint32_t hash = HashSlice(key);
                return shard_[Shard(hash)].Lookup(key, hash);
            }